

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O0

IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> * __thiscall
linq::IEnumerable<int>::Take
          (IEnumerableCore<linq::TakeState<linq::IEnumerable<int>,_int>_> *__return_storage_ptr__,
          IEnumerable<int> *this,size_t count)

{
  IEnumerableCore<linq::IEnumerable<int>_> local_38;
  size_t local_20;
  size_t count_local;
  IEnumerable<int> *this_local;
  
  local_20 = count;
  count_local = (size_t)this;
  this_local = (IEnumerable<int> *)__return_storage_ptr__;
  IEnumerableCore<linq::IEnumerable<int>_>::IEnumerableCore(&local_38,this);
  IEnumerableCore<linq::IEnumerable<int>_>::Take(__return_storage_ptr__,&local_38,local_20);
  IEnumerableCore<linq::IEnumerable<int>_>::~IEnumerableCore(&local_38);
  return __return_storage_ptr__;
}

Assistant:

IEnumerableCore<TakeState<IEnumerable<T>, T>> IEnumerable<T>::Take(size_t count) { return IEnumerableCore<IEnumerable<T>>(std::move(*this)).Take(count); }